

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_map.hpp
# Opt level: O3

bool __thiscall tcmalloc::PageMap::Set(PageMap *this,uint64_t key,void *value)

{
  bool bVar1;
  internal_type_help *__s;
  leaf_type_help *__s_00;
  void ***pppvVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = key >> 0x2a;
  __s = (internal_type_help *)this->roots[uVar5];
  if (__s == (internal_type_help *)0x0) {
    __s = FixedAllocator<tcmalloc::PageMap::internal_type_help>::Alloc(&this->internal_allocator);
    if (__s != (internal_type_help *)0x0) {
      memset(__s,0,0x400000);
      this->roots[uVar5] = __s->ptrs;
      goto LAB_0010624b;
    }
    this->roots[uVar5] = (void ***)0x0;
LAB_001062b3:
    bVar1 = false;
  }
  else {
LAB_0010624b:
    uVar3 = (uint)(key >> 0x14) & 0x3fffff;
    pppvVar2 = __s->ptrs[uVar3];
    if (pppvVar2 == (void ***)0x0) {
      __s_00 = FixedAllocator<tcmalloc::PageMap::leaf_type_help>::Alloc(&this->leaf_allocator);
      if (__s_00 != (leaf_type_help *)0x0) {
        memset(__s_00,0,0x100000);
      }
      uVar4 = (ulong)(uVar3 << 3);
      *(leaf_type_help **)((long)this->roots[uVar5] + uVar4) = __s_00;
      pppvVar2 = *(void ****)((long)this->roots[uVar5] + uVar4);
      if (pppvVar2 == (void ***)0x0) goto LAB_001062b3;
    }
    pppvVar2[(uint)key & 0xfffff] = (void **)value;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool Set(uint64_t key, void *value) {
        uint64_t k1 = key >> (internal_bits + leaf_bits);
        uint64_t k2 = (key >> leaf_bits) & ((1<<internal_bits) - 1);
        uint64_t k3 = key & ((1<<leaf_bits) -1);
        if (roots[k1] == nullptr) {
            roots[k1] = reinterpret_cast<void ***>(Alloc(INTERNAL));
            if (roots[k1] == nullptr) {
                return false;
            }
        }
        if (roots[k1][k2] == nullptr) {
            roots[k1][k2] = reinterpret_cast<void **>(Alloc(LEAF));
            if (roots[k1][k2] == nullptr) {
                return false;
            }
        }
        roots[k1][k2][k3] = value;
        return true;
    }